

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

int decompress_onepass(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  _func_void_j_decompress_ptr **pp_Var1;
  JDIMENSION JVar2;
  int iVar3;
  jpeg_d_coef_controller *pjVar4;
  jpeg_component_info *pjVar5;
  inverse_DCT_method_ptr p_Var6;
  boolean bVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  JDIMENSION JVar13;
  uint uVar14;
  int iVar15;
  JSAMPARRAY ppJVar16;
  ulong uVar17;
  ulong uVar18;
  
  pjVar4 = cinfo->coef;
  JVar2 = cinfo->total_iMCU_rows;
  uVar10 = cinfo->MCUs_per_row - 1;
  iVar12 = *(int *)((long)&pjVar4[1].start_input_pass + 4);
  pp_Var1 = &pjVar4[1].start_output_pass;
  do {
    if (*(int *)&pjVar4[1].consume_data <= iVar12) {
      cinfo->output_iMCU_row = cinfo->output_iMCU_row + 1;
      uVar10 = cinfo->input_iMCU_row + 1;
      cinfo->input_iMCU_row = uVar10;
      if (uVar10 < cinfo->total_iMCU_rows) {
        start_iMCU_row(cinfo);
        iVar12 = 3;
      }
      else {
        (*cinfo->inputctl->finish_input_pass)(cinfo);
        iVar12 = 4;
      }
      return iVar12;
    }
    for (uVar14 = *(uint *)&pjVar4[1].start_input_pass; uVar14 <= uVar10; uVar14 = uVar14 + 1) {
      if (cinfo->lim_Se != 0) {
        memset(*pp_Var1,0,(long)cinfo->blocks_in_MCU << 7);
      }
      bVar7 = (*cinfo->entropy->decode_mcu)(cinfo,(JBLOCKROW *)pp_Var1);
      if (bVar7 == 0) {
        *(int *)((long)&pjVar4[1].start_input_pass + 4) = iVar12;
        *(uint *)&pjVar4[1].start_input_pass = uVar14;
        return 0;
      }
      iVar15 = 0;
      for (lVar9 = 0; lVar9 < cinfo->comps_in_scan; lVar9 = lVar9 + 1) {
        pjVar5 = cinfo->cur_comp_info[lVar9];
        if (pjVar5->component_needed == 0) {
          iVar15 = iVar15 + pjVar5->MCU_blocks;
        }
        else {
          p_Var6 = cinfo->idct->inverse_DCT[pjVar5->component_index];
          iVar8 = pjVar5->DCT_v_scaled_size;
          ppJVar16 = output_buf[pjVar5->component_index] + iVar8 * iVar12;
          iVar3 = pjVar5->MCU_sample_width;
          uVar17 = 0;
          uVar18 = (ulong)(uint)(&pjVar5->MCU_width)[(ulong)(uVar10 <= uVar14) * 4];
          if ((&pjVar5->MCU_width)[(ulong)(uVar10 <= uVar14) * 4] < 1) {
            uVar18 = uVar17;
          }
          while (iVar11 = (int)uVar17, iVar11 < pjVar5->MCU_height) {
            if ((cinfo->input_iMCU_row < JVar2 - 1) || (iVar12 + iVar11 < pjVar5->last_row_height))
            {
              JVar13 = iVar3 * uVar14;
              for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
                (*p_Var6)(cinfo,pjVar5,(JCOEFPTR)pp_Var1[(long)iVar15 + uVar17],ppJVar16,JVar13);
                JVar13 = JVar13 + pjVar5->DCT_h_scaled_size;
              }
              iVar8 = pjVar5->DCT_v_scaled_size;
            }
            iVar15 = iVar15 + pjVar5->MCU_width;
            ppJVar16 = ppJVar16 + iVar8;
            uVar17 = (ulong)(iVar11 + 1);
          }
        }
      }
    }
    *(undefined4 *)&pjVar4[1].start_input_pass = 0;
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

METHODDEF(int)
decompress_onepass (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, useful_width;
  JSAMPARRAY output_ptr;
  JDIMENSION start_col, output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Loop to process as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->MCU_ctr; MCU_col_num <= last_MCU_col;
	 MCU_col_num++) {
      /* Try to fetch an MCU.  Entropy decoder expects buffer to be zeroed. */
      if (cinfo->lim_Se)	/* can bypass in DC only case */
	FMEMZERO((void FAR *) coef->MCU_buffer[0],
		 (size_t) (cinfo->blocks_in_MCU * SIZEOF(JBLOCK)));
      if (! (*cinfo->entropy->decode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->MCU_ctr = MCU_col_num;
	return JPEG_SUSPENDED;
      }
      /* Determine where data should go in output_buf and do the IDCT thing.
       * We skip dummy blocks at the right and bottom edges (but blkn gets
       * incremented past them!).  Note the inner loop relies on having
       * allocated the MCU_buffer[] blocks sequentially.
       */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	/* Don't bother to IDCT an uninteresting component. */
	if (! compptr->component_needed) {
	  blkn += compptr->MCU_blocks;
	  continue;
	}
	inverse_DCT = cinfo->idct->inverse_DCT[compptr->component_index];
	useful_width = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						    : compptr->last_col_width;
	output_ptr = output_buf[compptr->component_index] +
	  yoffset * compptr->DCT_v_scaled_size;
	start_col = MCU_col_num * compptr->MCU_sample_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (cinfo->input_iMCU_row < last_iMCU_row ||
	      yoffset+yindex < compptr->last_row_height) {
	    output_col = start_col;
	    for (xindex = 0; xindex < useful_width; xindex++) {
	      (*inverse_DCT) (cinfo, compptr,
			      (JCOEFPTR) coef->MCU_buffer[blkn+xindex],
			      output_ptr, output_col);
	      output_col += compptr->DCT_h_scaled_size;
	    }
	  }
	  blkn += compptr->MCU_width;
	  output_ptr += compptr->DCT_v_scaled_size;
	}
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->MCU_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  cinfo->output_iMCU_row++;
  if (++(cinfo->input_iMCU_row) < cinfo->total_iMCU_rows) {
    start_iMCU_row(cinfo);
    return JPEG_ROW_COMPLETED;
  }
  /* Completed the scan */
  (*cinfo->inputctl->finish_input_pass) (cinfo);
  return JPEG_SCAN_COMPLETED;
}